

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

classification mjs::anon_unknown_2::classify(uint32_t ch)

{
  classification cVar1;
  runtime_error *this;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  if (ch < 0xe01f0) {
    cVar1 = id_part;
    if (ch != 0xe01ef) {
      iVar4 = 0x51d;
      uVar2 = 0;
      do {
        while( true ) {
          uVar3 = ((uint)(iVar4 - (int)uVar2) >> 1) + (int)uVar2;
          if (*(uint *)(unicode::classification_run_start + (ulong)uVar3 * 4) <= ch) break;
          iVar4 = uVar3 - 1;
        }
        uVar2 = (ulong)(uVar3 + 1);
      } while (*(uint *)(unicode::classification_run_start + uVar2 * 4) <= ch);
      cVar1 = unicode::classification_run_type[uVar3];
    }
    return cVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Unicode character out of range");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr unicode::classification classify(const uint32_t ch) {
    constexpr auto asize = static_cast<int>(sizeof(unicode::classification_run_start)/sizeof(*unicode::classification_run_start));
    if (ch > unicode::classification_run_start[asize-1]) {
        throw std::runtime_error("Unicode character out of range");
    } else if (ch == unicode::classification_run_start[asize-1]) {
        // Very unlikely
        return unicode::classification_run_type[asize-1];
    }    
    for (uint32_t low = 0, high = asize-1;;) {
        const uint32_t index = low + (high-low) / 2;
        if (ch < unicode::classification_run_start[index]) {
            high = index - 1;
        } else if (ch >= unicode::classification_run_start[index+1]) {
            low = index + 1;
        } else {
            return unicode::classification_run_type[index];
        }
    }
}